

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

EqualLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_equal(NeuralNetworkLayer *this)

{
  bool bVar1;
  EqualLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_equal(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_equal(this);
    this_00 = (EqualLayerParams *)operator_new(0x18);
    EqualLayerParams::EqualLayerParams(this_00);
    (this->layer_).equal_ = this_00;
  }
  return (EqualLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::EqualLayerParams* NeuralNetworkLayer::mutable_equal() {
  if (!has_equal()) {
    clear_layer();
    set_has_equal();
    layer_.equal_ = new ::CoreML::Specification::EqualLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.equal)
  return layer_.equal_;
}